

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void totalFinalize(sqlite3_context *context)

{
  double *pdVar1;
  double val;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if (pdVar1 == (double *)0x0) {
    val = 0.0;
  }
  else {
    val = *pdVar1;
  }
  sqlite3VdbeMemSetDouble(&context->s,val);
  return;
}

Assistant:

static void totalFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
  sqlite3_result_double(context, p ? p->rSum : (double)0);
}